

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

numeric * cs_impl::runtime_cs_ext::argument_count(var *func)

{
  bool bVar1;
  size_t sVar2;
  callable *pcVar3;
  string *str;
  any *in_RSI;
  numeric *in_RDI;
  function_type *target_1;
  function_type *target;
  any *in_stack_ffffffffffffff70;
  allocator *this;
  numeric *this_00;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  allocator local_61;
  string local_60 [32];
  size_t local_40;
  size_t local_38;
  function_type *local_30;
  unsigned_long local_28;
  unsigned_long local_20;
  function_type *local_18;
  
  this_00 = in_RDI;
  any::type(in_stack_ffffffffffffff70);
  bVar1 = std::type_info::operator==((type_info *)this_00,(type_info *)in_RDI);
  if (bVar1) {
    any::const_val<cs::object_method>(in_RSI);
    pcVar3 = any::const_val<cs::callable>(in_RSI);
    local_18 = cs::callable::get_raw_data(pcVar3);
    std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
    target_type((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    bVar1 = std::type_info::operator==((type_info *)this_00,(type_info *)in_RDI);
    if (bVar1) {
      std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
      target<cs::function>
                ((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                  *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      sVar2 = cs::function::argument_count((function *)0x43b529);
      local_20 = sVar2 - 1;
      cs::numeric::numeric<unsigned_long>(in_RDI,&local_20);
    }
    else {
      std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
      target<cs_impl::cni>
                ((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                  *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      sVar2 = cni::argument_count((cni *)0x43b55b);
      local_28 = sVar2 - 1;
      cs::numeric::numeric<unsigned_long>(in_RDI,&local_28);
    }
  }
  else {
    any::type(in_stack_ffffffffffffff70);
    bVar1 = std::type_info::operator==((type_info *)this_00,(type_info *)in_RDI);
    if (!bVar1) {
      str = (string *)__cxa_allocate_exception(0x20);
      this = &local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"Not a function.",this);
      cs::lang_error::lang_error((lang_error *)this,str);
      __cxa_throw(str,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
    }
    pcVar3 = any::const_val<cs::callable>(in_RSI);
    local_30 = cs::callable::get_raw_data(pcVar3);
    std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
    target_type((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    bVar1 = std::type_info::operator==((type_info *)this_00,(type_info *)in_RDI);
    if (bVar1) {
      std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
      target<cs::function>
                ((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                  *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      local_38 = cs::function::argument_count((function *)0x43b5e8);
      cs::numeric::numeric<unsigned_long>(in_RDI,&local_38);
    }
    else {
      std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
      target<cs_impl::cni>
                ((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                  *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      local_40 = cni::argument_count((cni *)0x43b613);
      cs::numeric::numeric<unsigned_long>(in_RDI,&local_40);
    }
  }
  return this_00;
}

Assistant:

numeric argument_count(const var &func)
		{
			if (func.type() == typeid(object_method)) {
				const callable::function_type &target = func.const_val<object_method>().callable.const_val<callable>().get_raw_data();
				if (target.target_type() == typeid(function))
					return target.target<function>()->argument_count() - 1;
				else
					return target.target<cni>()->argument_count() - 1;
			}
			else if (func.type() == typeid(callable)) {
				const callable::function_type &target = func.const_val<callable>().get_raw_data();
				if (target.target_type() == typeid(function))
					return target.target<function>()->argument_count();
				else
					return target.target<cni>()->argument_count();
			}
			else
				throw lang_error("Not a function.");
		}